

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> * __thiscall
cmDebugger_impl::GetWatchpoints
          (vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  _Base_ptr this_00;
  int iVar1;
  _Atomic_word _Var2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::reserve
            (__return_storage_ptr__,
             (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var3 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header)
    {
      pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
      return __return_storage_ptr__;
    }
    this_00 = p_Var3[1]._M_left;
    if (this_00 != (_Base_ptr)0x0) {
      _Var2 = *(_Atomic_word *)&this_00->_M_parent;
      do {
        if (_Var2 == 0) goto LAB_0033190a;
        LOCK();
        iVar1 = *(int *)&this_00->_M_parent;
        bVar4 = _Var2 == iVar1;
        if (bVar4) {
          *(_Atomic_word *)&this_00->_M_parent = _Var2 + 1;
          iVar1 = _Var2;
        }
        _Var2 = iVar1;
        UNLOCK();
      } while (!bVar4);
      if ((*(int *)&this_00->_M_parent != 0) &&
         ((value_type *)p_Var3[1]._M_parent != (value_type *)0x0)) {
        std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::push_back
                  (__return_storage_ptr__,(value_type *)p_Var3[1]._M_parent);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
LAB_0033190a:
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

std::vector<cmWatchpoint> GetWatchpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    std::vector<cmWatchpoint> rtn;
    rtn.reserve(activeWatchpoints.size());
    for (auto& watchWeak : activeWatchpoints) {
      if (auto watch = watchWeak.second.lock()) {
        rtn.push_back(*watch);
      }
    }
    return rtn;
  }